

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O3

bool __thiscall cmQtAutoGenGlobalInitializer::generate(cmQtAutoGenGlobalInitializer *this)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  pointer puVar4;
  
  bVar3 = InitializeCustomTargets(this);
  if (bVar3) {
    puVar1 = (this->Initializers_).
             super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->Initializers_).
             super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar1 == puVar2) {
      bVar3 = true;
    }
    else {
      do {
        puVar4 = puVar1 + 1;
        bVar3 = cmQtAutoGenInitializer::SetupCustomTargets
                          ((puVar1->_M_t).
                           super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
                           .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>._M_head_impl);
        if (!bVar3) {
          return bVar3;
        }
        puVar1 = puVar4;
      } while (puVar4 != puVar2);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmQtAutoGenGlobalInitializer::generate()
{
  return (InitializeCustomTargets() && SetupCustomTargets());
}